

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.h
# Opt level: O1

void __thiscall wabt::Features::EnableAll(Features *this)

{
  this->exceptions_enabled_ = true;
  this->mutable_globals_enabled_ = true;
  this->sat_float_to_int_enabled_ = true;
  this->sign_extension_enabled_ = true;
  this->simd_enabled_ = true;
  this->threads_enabled_ = true;
  this->function_references_enabled_ = true;
  this->multi_value_enabled_ = true;
  this->tail_call_enabled_ = true;
  this->bulk_memory_enabled_ = true;
  this->reference_types_enabled_ = true;
  this->annotations_enabled_ = true;
  this->code_metadata_enabled_ = true;
  this->gc_enabled_ = true;
  this->memory64_enabled_ = true;
  this->multi_memory_enabled_ = true;
  this->extended_const_enabled_ = true;
  this->relaxed_simd_enabled_ = true;
  return;
}

Assistant:

void EnableAll() {
#define WABT_FEATURE(variable, flag, default_, help) enable_##variable();
#include "wabt/feature.def"
#undef WABT_FEATURE
  }